

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O3

int lws_buflist_append_segment(lws_buflist **head,uint8_t *buf,size_t len)

{
  lws_buflist *plVar1;
  lws_buflist *plVar2;
  int iVar3;
  uint uVar4;
  char *format;
  
  plVar2 = *head;
  if (buf == (uint8_t *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                  ,0x2a,
                  "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
  }
  if (len == 0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                  ,0x2b,
                  "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
  }
  if (plVar2 != (lws_buflist *)0x0) {
    iVar3 = -0x400;
    plVar1 = plVar2;
    do {
      head = &plVar1->next;
      iVar3 = iVar3 + 1;
      if (iVar3 == 0) {
        format = "%s: buflist reached sanity limit\n";
        goto LAB_0013827a;
      }
      plVar1 = ((lws_buflist *)head)->next;
      if ((lws_buflist *)head == plVar1) {
        format = "%s: corrupt list points to self\n";
        goto LAB_0013827a;
      }
    } while (plVar1 != (lws_buflist *)0x0);
  }
  uVar4 = (uint)(plVar2 == (lws_buflist *)0x0);
  _lws_log(8,"%s: len %u first %d %p\n","lws_buflist_append_segment",len & 0xffffffff,
           (ulong)(plVar2 == (lws_buflist *)0x0));
  plVar2 = (lws_buflist *)lws_realloc((void *)0x0,len + 0x29,"lws_buflist_append_segment");
  if (plVar2 == (lws_buflist *)0x0) {
    format = "%s: OOM\n";
LAB_0013827a:
    _lws_log(1,format,"lws_buflist_append_segment");
    uVar4 = 0xffffffff;
  }
  else {
    plVar2->len = len;
    plVar2->pos = 0;
    plVar2->next = (lws_buflist *)0x0;
    memcpy(&plVar2[1].pos,buf,len);
    ((lws_buflist *)head)->next = plVar2;
  }
  return uVar4;
}

Assistant:

int
lws_buflist_append_segment(struct lws_buflist **head, const uint8_t *buf,
			   size_t len)
{
	struct lws_buflist *nbuf;
	int first = !*head;
	void *p = *head;
	int sanity = 1024;

	assert(buf);
	assert(len);

	/* append at the tail */
	while (*head) {
		if (!--sanity) {
			lwsl_err("%s: buflist reached sanity limit\n", __func__);
			return -1;
		}
		if (*head == (*head)->next) {
			lwsl_err("%s: corrupt list points to self\n", __func__);
			return -1;
		}
		head = &((*head)->next);
	}

	(void)p;
	lwsl_info("%s: len %u first %d %p\n", __func__, (unsigned int)len,
					      first, p);

	nbuf = (struct lws_buflist *)lws_malloc(sizeof(struct lws_buflist) +
						len + LWS_PRE + 1, __func__);
	if (!nbuf) {
		lwsl_err("%s: OOM\n", __func__);
		return -1;
	}

	nbuf->len = len;
	nbuf->pos = 0;
	nbuf->next = NULL;

	/* whoever consumes this might need LWS_PRE from the start... */
	p = (uint8_t *)nbuf + sizeof(*nbuf) + LWS_PRE;
	memcpy(p, buf, len);

	*head = nbuf;

	return first; /* returns 1 if first segment just created */
}